

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int collationMatch(char *zColl,Index *pIndex)

{
  int iVar1;
  char *z;
  int i;
  Index *pIndex_local;
  char *zColl_local;
  
  z._4_4_ = 0;
  while( true ) {
    if ((int)(uint)pIndex->nColumn <= z._4_4_) {
      return 0;
    }
    if ((-1 < pIndex->aiColumn[z._4_4_]) &&
       (iVar1 = sqlite3StrICmp(pIndex->azColl[z._4_4_],zColl), iVar1 == 0)) break;
    z._4_4_ = z._4_4_ + 1;
  }
  return 1;
}

Assistant:

static int collationMatch(const char *zColl, Index *pIndex){
  int i;
  assert( zColl!=0 );
  for(i=0; i<pIndex->nColumn; i++){
    const char *z = pIndex->azColl[i];
    assert( z!=0 || pIndex->aiColumn[i]<0 );
    if( pIndex->aiColumn[i]>=0 && 0==sqlite3StrICmp(z, zColl) ){
      return 1;
    }
  }
  return 0;
}